

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

void start_iMCU_row(j_compress_ptr cinfo)

{
  jpeg_c_coef_controller *pjVar1;
  int iVar2;
  
  pjVar1 = cinfo->coef;
  if (cinfo->comps_in_scan < 2) {
    if (*(uint *)&pjVar1[1].start_pass < cinfo->total_iMCU_rows - 1) {
      iVar2 = cinfo->cur_comp_info[0]->v_samp_factor;
    }
    else {
      iVar2 = cinfo->cur_comp_info[0]->last_row_height;
    }
    *(int *)((long)&pjVar1[1].compress_data + 4) = iVar2;
  }
  else {
    *(undefined4 *)((long)&pjVar1[1].compress_data + 4) = 1;
  }
  *(undefined8 *)((long)&pjVar1[1].start_pass + 4) = 0;
  return;
}

Assistant:

LOCAL(void)
start_iMCU_row (j_decompress_ptr cinfo)
/* Reset within-iMCU-row counters for a new row (input side) */
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  /* In an interleaved scan, an MCU row is the same as an iMCU row.
   * In a noninterleaved scan, an iMCU row has v_samp_factor MCU rows.
   * But at the bottom of the image, process only what's left.
   */
  if (cinfo->comps_in_scan > 1) {
    coef->MCU_rows_per_iMCU_row = 1;
  } else {
    if (cinfo->input_iMCU_row < (cinfo->total_iMCU_rows-1))
      coef->MCU_rows_per_iMCU_row = cinfo->cur_comp_info[0]->v_samp_factor;
    else
      coef->MCU_rows_per_iMCU_row = cinfo->cur_comp_info[0]->last_row_height;
  }

  coef->MCU_ctr = 0;
  coef->MCU_vert_offset = 0;
}